

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O0

void __thiscall trackerboy::Sequence::resize(Sequence *this,size_t size)

{
  bool bVar1;
  invalid_argument *this_00;
  byte *pbVar2;
  size_t size_local;
  Sequence *this_local;
  
  if (size < 0x101) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->mData,size);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->mLoop);
    if ((bVar1) && (pbVar2 = std::optional<unsigned_char>::operator*(&this->mLoop), size <= *pbVar2)
       ) {
      std::optional<unsigned_char>::reset(&this->mLoop);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"size must be less than or equal to 256");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Sequence::resize(size_t size) {
    if (size > MAX_SIZE) {
        throw std::invalid_argument("size must be less than or equal to 256");
    }
    mData.resize(size);
    if (mLoop && *mLoop >= size) {
        mLoop.reset();
    }
}